

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ZipArchiveIOSystem.cpp
# Opt level: O0

void __thiscall
Assimp::ZipArchiveIOSystem::Implement::getFileListExtension
          (Implement *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *rFileList,string *extension)

{
  bool bVar1;
  __type _Var2;
  string local_60;
  reference local_40;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::ZipFileInfo>
  *file;
  iterator __end1;
  iterator __begin1;
  ZipFileInfoMap *__range1;
  string *extension_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *rFileList_local;
  Implement *this_local;
  
  MapArchive(this);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::clear(rFileList);
  __end1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::ZipFileInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::ZipFileInfo>_>_>
           ::begin(&this->m_ArchiveMap);
  file = (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::ZipFileInfo>
          *)std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::ZipFileInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::ZipFileInfo>_>_>
            ::end(&this->m_ArchiveMap);
  while (bVar1 = std::operator!=(&__end1,(_Self *)&file), bVar1) {
    local_40 = std::
               _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::ZipFileInfo>_>
               ::operator*(&__end1);
    BaseImporter::GetExtension(&local_60,&local_40->first);
    _Var2 = std::operator==(extension,&local_60);
    std::__cxx11::string::~string((string *)&local_60);
    if (_Var2) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(rFileList,&local_40->first);
    }
    std::
    _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::ZipFileInfo>_>
    ::operator++(&__end1);
  }
  return;
}

Assistant:

void ZipArchiveIOSystem::Implement::getFileListExtension(std::vector<std::string>& rFileList, const std::string& extension) {
        MapArchive();
        rFileList.clear();

        for (const auto &file : m_ArchiveMap) {
            if (extension == BaseImporter::GetExtension(file.first))
                rFileList.push_back(file.first);
        }
    }